

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

char32_t dpfb::unicode::strToCp(char *str,char **end)

{
  bool bVar1;
  int iVar2;
  char32_t cVar3;
  byte local_3a;
  uchar c;
  bool wasDigits;
  uint cutlimit;
  uint cutoff;
  uint max;
  int base;
  char *strStart;
  char32_t result;
  char **end_local;
  char *str_local;
  
  strStart._4_4_ = L'\0';
  end_local = (char **)str;
  while (iVar2 = isspace((int)*(char *)end_local), iVar2 != 0) {
    end_local = (char **)((long)end_local + 1);
  }
  if ((*(char *)end_local == 'U') && (*(char *)((long)end_local + 1) == '+')) {
    cutoff = 0x10;
    end_local = (char **)((long)end_local + 2);
  }
  else {
    cutoff = 10;
  }
  cVar3 = (char32_t)(0xffffffff / (ulong)cutoff);
  bVar1 = false;
  do {
    local_3a = *(byte *)end_local;
    if ((local_3a < 0x30) || (0x39 < local_3a)) {
      if (cutoff != 0x10) {
LAB_0014fb0c:
        if (end != (char **)0x0) {
          if (bVar1) {
            *end = (char *)end_local;
          }
          else {
            *end = str;
          }
        }
        return strStart._4_4_;
      }
      if ((local_3a < 0x61) || (0x66 < local_3a)) {
        if ((local_3a < 0x41) || (0x46 < local_3a)) goto LAB_0014fb0c;
        local_3a = local_3a - 0x37;
      }
      else {
        local_3a = local_3a + 0xa9;
      }
    }
    else {
      local_3a = local_3a - 0x30;
    }
    bVar1 = true;
    end_local = (char **)((long)end_local + 1);
    if (((strStart._4_4_ == L'\xffffffff') || ((uint)cVar3 < (uint)strStart._4_4_)) ||
       ((strStart._4_4_ == cVar3 && ((uint)(0xffffffff % (ulong)cutoff) < (uint)local_3a)))) {
      strStart._4_4_ = L'\xffffffff';
    }
    else {
      strStart._4_4_ = (uint)local_3a + cutoff * strStart._4_4_;
    }
  } while( true );
}

Assistant:

char32_t strToCp(const char* str, const char** end)
{
    // It's easier to roll our own routine than to use strtol(),
    // because otherwise we need:
    //    1. Ensure there is no leading -.
    //    2. Take into account that strtol() accepts optional "0x"
    //       or "0X" prefixes for base 16, which we should treat
    //       as 0.

    char32_t result = 0;

    const char* strStart = str;

    while (std::isspace(*str))
        ++str;

    int base;
    if (*str == 'U' && str[1] == '+') {
        base = 16;
        str += 2;
    } else
        base = 10;

    const auto max = UINT_LEAST32_MAX;
    const auto cutoff = max / base;
    const auto cutlimit = max % base;

    bool wasDigits = false;
    while (true) {
        unsigned char c = *str;

        if (c >= '0' && c <= '9')
            c -= '0';
        else if (base == 16) {
            if (c >= 'a' && c <= 'f')
                c -= 'a' - 10;
            else if (c >= 'A' && c <= 'F')
                c -= 'A' - 10;
            else
                break;
        } else
            break;

        wasDigits = true;
        ++str;

        if (result == max
                || result > cutoff
                || (result == cutoff && c > cutlimit))
            result = max;
        else {
            result *= base;
            result += c;
        }
    }

    if (end) {
        if (wasDigits)
            *end = str;
        else
            *end = strStart;
    }

    return result;
}